

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest_OpenForAppend_Test::LogTest_OpenForAppend_Test
          (LogTest_OpenForAppend_Test *this)

{
  LogTest_OpenForAppend_Test *this_local;
  
  LogTest::LogTest(&this->super_LogTest);
  (this->super_LogTest).super_Test._vptr_Test =
       (_func_int **)&PTR__LogTest_OpenForAppend_Test_00192ed0;
  return;
}

Assistant:

TEST_F(LogTest, OpenForAppend) {
  Write("hello");
  ReopenForAppend();
  Write("world");
  ASSERT_EQ("hello", Read());
  ASSERT_EQ("world", Read());
  ASSERT_EQ("EOF", Read());
}